

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::create_requantize_op(ConvolutionDepthWise *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  float fVar1;
  size_t sVar2;
  iterator iVar3;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  int iVar6;
  Layer *pLVar7;
  long lVar8;
  long lVar9;
  float scale_out;
  ParamDict pd;
  float local_9d0;
  float local_9cc;
  Mat local_9c8;
  vector<float,std::allocator<float>> *local_980;
  ModelBinFromMatArray local_978;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined4 uStack_960;
  Allocator *local_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  ParamDict local_930;
  
  if (this->use_int8_requantize == false) {
    create_requantize_op();
    iVar6 = -1;
  }
  else {
    this_00 = &this->requantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_00,(long)this->group);
    if (0 < this->group) {
      local_980 = (vector<float,std::allocator<float>> *)&this->requantize_scales;
      lVar9 = 0;
      do {
        pLVar7 = create_layer(0x3f);
        (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar9] = pLVar7;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar9 * 4);
        local_9cc = 0.0;
        if (fVar1 != 0.0) {
          local_9cc = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                               lVar9 * 4));
        }
        local_9d0 = this->top_blob_int8_scale;
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,local_9cc);
        ParamDict::set(&local_930,1,local_9d0);
        ParamDict::set(&local_930,2,this->bias_term);
        ParamDict::set(&local_930,3,1);
        pLVar7 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        (*pLVar7->_vptr_Layer[2])(pLVar7,&local_930);
        sVar2 = (this->bias_data).elemsize;
        local_9c8.data = (void *)(sVar2 * lVar9 + (long)(this->bias_data).data);
        local_9c8.elempack = (this->bias_data).elempack;
        local_9c8.allocator = (this->bias_data).allocator;
        uStack_968 = (undefined4)sVar2;
        uStack_964 = (undefined4)(sVar2 >> 0x20);
        local_9c8.cstep = 1;
        local_9c8.h = 1;
        local_9c8.c = 1;
        local_9c8.dims = 1;
        local_9c8.w = 1;
        local_9c8.elemsize._4_4_ = uStack_964;
        local_9c8.elemsize._0_4_ = uStack_968;
        local_9c8.refcount._4_4_ = 0;
        local_9c8.refcount._0_4_ = 0;
        uStack_968 = 0;
        uStack_964 = 0;
        uStack_960 = 0;
        local_978.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_978.weights._0_4_ = 0;
        local_978.weights._4_4_ = 0;
        local_950 = 0;
        uStack_948 = 0;
        local_940 = 0;
        pLVar7 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        local_958 = local_9c8.allocator;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_978,&local_9c8);
        (*pLVar7->_vptr_Layer[3])(pLVar7,&local_978);
        ModelBin::~ModelBin(&local_978.super_ModelBin);
        iVar3._M_current =
             (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_980,iVar3,&local_9cc);
        }
        else {
          *iVar3._M_current = local_9cc;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar3._M_current =
             (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_980,iVar3,&local_9d0);
        }
        else {
          *iVar3._M_current = local_9d0;
          (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        piVar4 = (int *)CONCAT44(local_9c8.refcount._4_4_,local_9c8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_9c8.allocator == (Allocator *)0x0) {
              if (local_9c8.data != (void *)0x0) {
                free(local_9c8.data);
              }
            }
            else {
              (*(local_9c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_9c8.elemsize._0_4_ = 0;
        local_9c8.elemsize._4_4_ = 0;
        local_9c8.elempack = 0;
        local_9c8.data = (void *)0x0;
        local_9c8.refcount._0_4_ = 0;
        local_9c8.refcount._4_4_ = 0;
        local_9c8.dims = 0;
        local_9c8.w = 0;
        local_9c8.h = 0;
        local_9c8.c = 0;
        local_9c8.cstep = 0;
        lVar8 = 0x8c0;
        do {
          piVar4 = *(int **)((long)&local_930.params[0].v.data + lVar8);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              __ptr = *(void **)((long)&local_930.params[0].type + lVar8);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar8);
              if (plVar5 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar8 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar8 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar8) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar8) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar8) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar8) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar8) = 0;
          lVar8 = lVar8 + -0x48;
        } while (lVar8 != -0x40);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->group);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int ConvolutionDepthWise::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(group);
    for (int g=0; g<group; g++)
    {
        requantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[g] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[g]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(g, 1);

        requantize_ops[g]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}